

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_precedence(gravity_parser_t *parser,prec_level precedence)

{
  gtoken_s token;
  gravity_parser_t *pgVar1;
  uint uVar2;
  gtoken_t gVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  gravity_parser_t *local_b0;
  grammar_rule *rule;
  gtoken_t tok;
  gtoken_t peek;
  uint32_t uStack_88;
  uint32_t uStack_84;
  uint32_t local_80;
  uint32_t uStack_7c;
  uint32_t uStack_78;
  gbuiltin_t gStack_74;
  char *local_70;
  gravity_parser_t *local_68;
  gnode_t *node;
  parse_func local_38;
  parse_func prefix;
  gravity_lexer_t *pgStack_28;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *pgStack_18;
  prec_level precedence_local;
  gravity_parser_t *parser_local;
  
  pgStack_28 = parser->lexer->p[parser->lexer->n - 1];
  lexer._4_4_ = precedence;
  pgStack_18 = parser;
  prefix._4_4_ = gravity_lexer_peek(pgStack_28);
  if (prefix._4_4_ == TOK_EOF) {
    parser_local = (gravity_parser_t *)0x0;
  }
  else {
    local_38 = rules[prefix._4_4_].prefix;
    if ((local_38 == (parse_func)0x0) ||
       (uVar2 = pgStack_18->expr_depth + 1, pgStack_18->expr_depth = uVar2, uVar2 < 0x201)) {
      if (local_38 == (parse_func)0x0) {
        local_b0 = (gravity_parser_t *)0x0;
      }
      else {
        local_b0 = (gravity_parser_t *)(*local_38)(pgStack_18);
      }
      local_68 = local_b0;
      if ((local_38 == (parse_func)0x0) ||
         (pgStack_18->expr_depth = pgStack_18->expr_depth - 1, local_b0 == (gravity_parser_t *)0x0))
      {
        gravity_lexer_next(pgStack_28);
        pgVar1 = pgStack_18;
        gravity_lexer_token((gtoken_s *)&tok,pgStack_28);
        pcVar4 = token_name(prefix._4_4_);
        token.lineno = peek;
        token.type = tok;
        token.colno = uStack_88;
        token.position = uStack_84;
        token.bytes = local_80;
        token.length = uStack_7c;
        token.fileid = uStack_78;
        token.builtin = gStack_74;
        token.value = local_70;
        report_error(pgVar1,GRAVITY_ERROR_SYNTAX,token,"Expected expression but found %s.",pcVar4,
                     in_R8,in_R9);
        parser_local = (gravity_parser_t *)0x0;
      }
      else {
        rule._4_4_ = gravity_lexer_peek(pgStack_28);
        if (rule._4_4_ == TOK_EOF) {
          parser_local = local_68;
        }
        else {
          do {
            if (rules[rule._4_4_].precedence <= lexer._4_4_) break;
            gVar3 = gravity_lexer_next(pgStack_28);
            pgStack_18->current_token = gVar3;
            pgStack_18->current_node = (gnode_t *)local_68;
            local_68 = (gravity_parser_t *)(*rules[gVar3].infix)(pgStack_18);
            rule._4_4_ = gravity_lexer_peek(pgStack_28);
          } while (rule._4_4_ != TOK_EOF);
          parser_local = local_68;
        }
      }
    }
    else {
      gravity_lexer_next(pgStack_28);
      pgVar1 = pgStack_18;
      gravity_lexer_token((gtoken_s *)&node,pgStack_28);
      report_error(pgVar1,GRAVITY_ERROR_SYNTAX,0x1756df);
      parser_local = (gravity_parser_t *)0x0;
    }
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_precedence(gravity_parser_t *parser, prec_level precedence) {
    DEBUG_PARSER("parse_precedence (level %d)", precedence);
    DECLARE_LEXER;

    // peek next and check for EOF
    gtoken_t type = gravity_lexer_peek(lexer);
    if (type == TOK_EOF) return NULL;

    // execute prefix callback (if any)
    parse_func prefix = rules[type].prefix;

    // to protect stack from excessive recursion
    if (prefix && (++parser->expr_depth > MAX_EXPRESSION_DEPTH)) {
        // consume next token to avoid infinite loops
        gravity_lexer_next(lexer);
        REPORT_ERROR(gravity_lexer_token(lexer), "Maximum expression depth reached.");
        return NULL;
    }
    gnode_t *node = (prefix) ? prefix(parser) : NULL;
    if (prefix) --parser->expr_depth;

    if (!prefix || !node) {
        // we need to consume next token because error was triggered in peek
        gravity_lexer_next(lexer);
        REPORT_ERROR(gravity_lexer_token(lexer), "Expected expression but found %s.", token_name(type));
        return NULL;
    }

    // peek next and check for EOF
    gtoken_t peek = gravity_lexer_peek(lexer);
    if (peek == TOK_EOF) return node;

    while (precedence < rules[peek].precedence) {
        gtoken_t tok = gravity_lexer_next(lexer);
        grammar_rule *rule = &rules[tok];

        // execute infix callback
        parser->current_token = tok;
        parser->current_node = node;
        node = rule->infix(parser);

        // peek next and check for EOF
        peek = gravity_lexer_peek(lexer);
        if (peek == TOK_EOF) break;
    }

    return node;
}